

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactor<double>::vSolveLeft2sparse
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int *rn,
          double *vec2,int *idx2,double *rhs2,int *ridx2,int *rn2)

{
  int iVar1;
  
  if ((this->l).updateType == 0) {
    iVar1 = solveUpdateLeft(this,eps,rhs,ridx,*rn);
    *rn = iVar1;
    iVar1 = solveUleft(this,eps,vec,idx,rhs,ridx,iVar1);
    *rn = iVar1;
    iVar1 = solveUpdateLeft(this,eps,rhs2,ridx2,*rn2);
    *rn2 = iVar1;
    iVar1 = solveUleft(this,eps,vec2,idx2,rhs2,ridx2,iVar1);
  }
  else {
    iVar1 = solveUleft(this,eps,vec,idx,rhs,ridx,*rn);
    *rn = iVar1;
    iVar1 = solveLleftForest(this,eps,vec,idx,iVar1);
    *rn = iVar1;
    iVar1 = solveUleft(this,eps,vec2,idx2,rhs2,ridx2,*rn2);
    *rn2 = iVar1;
    iVar1 = solveLleftForest(this,eps,vec2,idx2,iVar1);
  }
  *rn2 = iVar1;
  iVar1 = solveLleft(this,eps,vec,idx,*rn);
  *rn = iVar1;
  iVar1 = solveLleft(this,eps,vec2,idx2,*rn2);
  *rn2 = iVar1;
  return;
}

Assistant:

void CLUFactor<R>::vSolveLeft2sparse(R eps,
                                     R* vec, int* idx,                      /* result */
                                     R* rhs, int* ridx, int& rn,            /* rhs    */
                                     R* vec2, int* idx2,                    /* result2 */
                                     R* rhs2, int* ridx2, int& rn2)         /* rhs2    */
{
   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      rn2 = solveUleft(eps, vec2, idx2, rhs2, ridx2, rn2);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      rn2 = solveUleft(eps, vec2, idx2, rhs2, ridx2, rn2);
      rn2 = solveLleftForest(eps, vec2, idx2, rn2);

   }

   rn = solveLleft(eps, vec, idx, rn);
   rn2 = solveLleft(eps, vec2, idx2, rn2);
}